

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFraigRestore(int nPatsRand,int nPatsDyna,int nBTLimit)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *p;
  void *Entry;
  void *Entry_00;
  Abc_Ntk_t *pAVar4;
  Fraig_Params_t local_70;
  
  p = Abc_FrameReadStore();
  if (p->nSize == 0) {
    puts("There are no network currently in storage.");
    pAVar4 = (Abc_Ntk_t *)0x0;
  }
  else {
    Entry = Vec_PtrEntry(p,0);
    if (1 < p->nSize) {
      uVar2 = p->nSize - 1;
      p->nSize = uVar2;
      Entry = p->pArray[uVar2];
      Entry_00 = Vec_PtrEntry(p,0);
      Vec_PtrPush(p,Entry_00);
      Vec_PtrWriteEntry(p,0,Entry);
    }
    iVar3 = (int)(0x8000000 /
                 (long)(*(int *)(*(long *)((long)Entry + 0x38) + 4) + *(int *)((long)Entry + 0x7c)))
    ;
    iVar1 = 0x20;
    if (iVar3 < 0x20) {
      iVar1 = iVar3;
    }
    Fraig_ParamsSetDefault(&local_70);
    local_70.nPatsRand = nPatsRand;
    if (nPatsRand == 0) {
      local_70.nPatsRand = iVar1 << 5;
    }
    local_70.nPatsDyna = iVar1 << 5;
    if (nPatsDyna != 0) {
      local_70.nPatsDyna = nPatsDyna;
    }
    local_70.fFuncRed = 1;
    local_70.fFeedBack = 1;
    local_70.fDist1Pats = 1;
    local_70.fDoSparse = 1;
    local_70.fChoicing = 1;
    local_70.fTryProve = 0;
    local_70.fInternal = 1;
    local_70.fVerbose = 0;
    local_70.nBTLimit = nBTLimit;
    pAVar4 = Abc_NtkFraigPartitioned(p,&local_70);
    Abc_NtkFraigStoreClean();
  }
  return pAVar4;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigRestore( int nPatsRand, int nPatsDyna, int nBTLimit )
{
    extern Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams );
    Fraig_Params_t Params;
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk, * pFraig;
    int nWords1, nWords2, nWordsMin;
//    abctime clk = Abc_Clock();

    // get the stored network
    vStore = Abc_FrameReadStore();
    if ( Vec_PtrSize(vStore) == 0 )
    {
        printf( "There are no network currently in storage.\n" );
        return NULL;
    }
//    printf( "Currently stored %d networks will be fraiged.\n", Vec_PtrSize(vStore) );
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    if ( Vec_PtrSize(vStore) > 1 )
    {
        pNtk = (Abc_Ntk_t *)Vec_PtrPop( vStore );
        Vec_PtrPush( vStore, Vec_PtrEntry(vStore,0) );
        Vec_PtrWriteEntry( vStore, 0, pNtk );
    }

    // to determine the number of simulation patterns
    // use the following strategy
    // at least 64 words (32 words random and 32 words dynamic)
    // no more than 256M for one circuit (128M + 128M)
    nWords1 = 32;
    nWords2 = (1<<27) / (Abc_NtkNodeNum(pNtk) + Abc_NtkCiNum(pNtk));
    nWordsMin = Abc_MinInt( nWords1, nWords2 );

    // set parameters for fraiging
    Fraig_ParamsSetDefault( &Params );
    Params.nPatsRand  = nPatsRand ? nPatsRand : nWordsMin * 32;    // the number of words of random simulation info
    Params.nPatsDyna  = nPatsDyna ? nPatsDyna : nWordsMin * 32;    // the number of words of dynamic simulation info
    Params.nBTLimit   = nBTLimit;          // the max number of backtracks to perform
    Params.fFuncRed   =    1;              // performs only one level hashing
    Params.fFeedBack  =    1;              // enables solver feedback
    Params.fDist1Pats =    1;              // enables distance-1 patterns
    Params.fDoSparse  =    1;              // performs equiv tests for sparse functions 
    Params.fChoicing  =    1;              // enables recording structural choices
    Params.fTryProve  =    0;              // tries to solve the final miter
    Params.fInternal  =    1;              // does not show progress bar
    Params.fVerbose   =    0;              // the verbosiness flag

    // perform partitioned computation of structural choices
    pFraig = Abc_NtkFraigPartitioned( vStore, &Params );
    Abc_NtkFraigStoreClean();
//ABC_PRT( "Total choicing time", Abc_Clock() - clk );
    return pFraig;
}